

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_node.h
# Opt level: O1

bool __thiscall
BufferNode<double,_long>::range_query
          (BufferNode<double,_long> *this,bool type,double lower_bound,double upper_bound,
          vector<std::pair<double,_long>,_std::allocator<std::pair<double,_long>_>_> *answers)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  long local_40;
  double local_38;
  
  Buffer::range_query(&this->buffer,lower_bound,upper_bound,answers);
  if ((int)CONCAT71(in_register_00000031,type) == 0) {
    sVar2 = find_precise_position(this,lower_bound);
    uVar3 = this->size;
    uVar5 = sVar2;
    if (sVar2 < uVar3) {
      do {
        uVar5 = sVar2;
        if (lower_bound <= this->keys[sVar2]) break;
        sVar2 = sVar2 + 1;
        uVar5 = uVar3;
      } while (uVar3 != sVar2);
    }
  }
  else {
    uVar5 = 0;
  }
  uVar3 = this->size;
  if ((uVar5 < uVar3) && (this->keys[uVar5] <= upper_bound)) {
    pdVar4 = this->keys + uVar5;
    uVar6 = uVar5;
    uVar1 = uVar5;
    do {
      uVar5 = uVar1 + 1;
      local_38 = *pdVar4;
      local_40 = this->payloads[uVar1];
      std::vector<std::pair<double,long>,std::allocator<std::pair<double,long>>>::
      emplace_back<double,long>
                ((vector<std::pair<double,long>,std::allocator<std::pair<double,long>>> *)answers,
                 &local_38,&local_40);
      uVar3 = this->size;
      if (uVar3 <= uVar5) break;
      uVar6 = uVar6 + 1;
      pdVar4 = this->keys + uVar6;
      uVar1 = uVar5;
    } while (this->keys[uVar5] <= upper_bound);
  }
  return uVar3 <= uVar5;
}

Assistant:

bool range_query(bool type, K lower_bound, K upper_bound, std::vector<std::pair<K, P>>& answers) const {
        buffer.range_query(lower_bound, upper_bound, answers);
        size_t it = 0;
        if (!type) {
            it = find_precise_position(lower_bound);
            while (it < size && less_than(get_key(it), lower_bound))
                ++it;
        }
        while (it < size && !greater_than(get_key(it), upper_bound)) {
            answers.emplace_back(get_key(it), get_payload(it));
            ++it;
        }
        if (it < size)
            return false;
        else
            return true;
    }